

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clients_map.c
# Opt level: O1

piga_status piga_clients_map_add(piga_clients_map *map,int shm_key,char *name,int name_length)

{
  long lVar1;
  piga_event_queue *ppVar2;
  int *piVar3;
  piga_status status;
  piga_status local_1c;
  
  piVar3 = &map->items[0].shm_id;
  lVar1 = 8;
  do {
    if (*(piga_event_queue **)(piVar3 + 1) == (piga_event_queue *)0x0) {
      memcpy((piga_clients_map_item *)(piVar3 + -0x15),name,(long)name_length);
      piVar3[-1] = shm_key;
      ppVar2 = (piga_event_queue *)piga_event_queue_connect_to_shm(shm_key,piVar3,&local_1c);
      if (local_1c != PIGA_STATUS_OK) {
        return local_1c;
      }
      *(piga_event_queue **)(piVar3 + 1) = ppVar2;
      return PIGA_STATUS_OK;
    }
    piVar3 = piVar3 + 0x18;
    lVar1 = lVar1 + -1;
  } while (lVar1 != 0);
  return PIGA_ERROR_NO_SPACE_LEFT_IN_MAP;
}

Assistant:

piga_status piga_clients_map_add(piga_clients_map* map, int shm_key, const char* name, int name_length)
{
    for(size_t i = 0; i < PIGA_CLIENTS_MAP_ITEM_NUMBER; ++i) {
        if(map->items[i].queue == 0) {
            // This item is still unused.
            piga_clients_map_item_set_name(&map->items[i], name, name_length);
            piga_clients_map_item_set_shm_key(&map->items[i], shm_key);
            
            // Receive the queue.
            piga_status status;
            piga_event_queue *queue;
            queue = piga_event_queue_connect_to_shm(shm_key, &(map->items[i].shm_id), &status);
            if(status != PIGA_STATUS_OK)
                return status;
            
            piga_clients_map_item_set_queue(&map->items[i], queue);
            return PIGA_STATUS_OK;
        }
    }
    return PIGA_ERROR_NO_SPACE_LEFT_IN_MAP; 
}